

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsession.cpp
# Opt level: O3

uint32_t __thiscall jrtplib::RTPSession::GetLocalSSRC(RTPSession *this)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((this->created & (this->packetbuilder).init) != 0) {
    uVar1 = (this->packetbuilder).ssrc;
  }
  return uVar1;
}

Assistant:

uint32_t RTPSession::GetLocalSSRC()
{
	if (!created)
		return 0;
	
	uint32_t ssrc;

	BUILDER_LOCK
	ssrc = packetbuilder.GetSSRC();
	BUILDER_UNLOCK
	return ssrc;
}